

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O1

void __thiscall sf::WindowBase::create(WindowBase *this,WindowHandle handle)

{
  WindowImpl *pWVar1;
  
  (*this->_vptr_WindowBase[4])();
  pWVar1 = priv::WindowImpl::create(handle);
  this->m_impl = pWVar1;
  initialize(this);
  return;
}

Assistant:

void WindowBase::create(WindowHandle handle)
{
    // Destroy the previous window implementation
    close();

    // Recreate the window implementation
    m_impl = priv::WindowImpl::create(handle);

    // Perform common initializations
    initialize();
}